

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::HashtablezInfo::PrepareForSampling
          (HashtablezInfo *this,int64_t stride,size_t inline_element_size_value,
          size_t key_size_value,size_t value_size_value,uint16_t soo_capacity_value)

{
  int32_t iVar1;
  Duration DVar2;
  uint16_t soo_capacity_value_local;
  size_t value_size_value_local;
  size_t key_size_value_local;
  size_t inline_element_size_value_local;
  int64_t stride_local;
  HashtablezInfo *this_local;
  memory_order __b_9;
  memory_order __b_8;
  memory_order __b_7;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->capacity).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->size).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->num_erases).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->num_rehashes).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->max_probe_length).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->total_probe_length).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->hashes_bitwise_or).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->hashes_bitwise_and).super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->hashes_bitwise_xor).super___atomic_base<unsigned_long>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->max_reserve).super___atomic_base<unsigned_long>._M_i = 0;
  DVar2 = (Duration)absl::lts_20240722::Now();
  (this->create_time).rep_ = DVar2;
  (this->super_Sample<absl::lts_20240722::container_internal::HashtablezInfo>).weight = stride;
  iVar1 = absl::lts_20240722::GetStackTrace(this->stack,0x40,0);
  this->depth = iVar1;
  this->inline_element_size = inline_element_size_value;
  this->key_size = key_size_value;
  this->value_size = value_size_value;
  this->soo_capacity = soo_capacity_value;
  return;
}

Assistant:

void HashtablezInfo::PrepareForSampling(int64_t stride,
                                        size_t inline_element_size_value,
                                        size_t key_size_value,
                                        size_t value_size_value,
                                        uint16_t soo_capacity_value) {
  capacity.store(0, std::memory_order_relaxed);
  size.store(0, std::memory_order_relaxed);
  num_erases.store(0, std::memory_order_relaxed);
  num_rehashes.store(0, std::memory_order_relaxed);
  max_probe_length.store(0, std::memory_order_relaxed);
  total_probe_length.store(0, std::memory_order_relaxed);
  hashes_bitwise_or.store(0, std::memory_order_relaxed);
  hashes_bitwise_and.store(~size_t{}, std::memory_order_relaxed);
  hashes_bitwise_xor.store(0, std::memory_order_relaxed);
  max_reserve.store(0, std::memory_order_relaxed);

  create_time = absl::Now();
  weight = stride;
  // The inliner makes hardcoded skip_count difficult (especially when combined
  // with LTO).  We use the ability to exclude stacks by regex when encoding
  // instead.
  depth = absl::GetStackTrace(stack, HashtablezInfo::kMaxStackDepth,
                              /* skip_count= */ 0);
  inline_element_size = inline_element_size_value;
  key_size = key_size_value;
  value_size = value_size_value;
  soo_capacity = soo_capacity_value;
}